

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::utp_stream::
async_read_some<boost::asio::mutable_buffer,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>>
          (utp_stream *this,mutable_buffer *buffers,
          io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
          *handler)

{
  io_context *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_(boost::system::error_code,_unsigned_long)>
  _Stack_a8;
  
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    boost::asio::ssl::detail::
    io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
    ::io_op(&_Stack_a8._M_f,handler);
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x6b;
    boost::asio::
    post<boost::asio::io_context,std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,(_Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_(boost::asio::error::basic_errors,_unsigned_long)>
                       *)&_Stack_a8,(type *)0x0);
  }
  else if ((this->m_read_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
    lVar4 = 0;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 0x10) {
      lVar2 = *(long *)((long)&buffers->size_ + lVar3);
      if (lVar2 != 0) {
        add_read_buffer(this,*(void **)((long)&buffers->data_ + lVar3),(int)lVar2);
        lVar4 = lVar4 + *(long *)((long)&buffers->size_ + lVar3);
      }
    }
    if (lVar4 != 0) {
      ::std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                 &this->m_read_handler,handler);
      issue_read(this);
      return;
    }
    piVar1 = this->m_io_service;
    boost::asio::ssl::detail::
    io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
    ::io_op(&_Stack_a8._M_f,handler);
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0;
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.failed_ = false;
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    boost::asio::
    post<boost::asio::io_context,std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>(boost::system::error_code,unsigned_long)>>
              (piVar1,&_Stack_a8,(type *)0x0);
  }
  else {
    piVar1 = this->m_io_service;
    boost::asio::ssl::detail::
    io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
    ::io_op(&_Stack_a8._M_f,handler);
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<1UL,_unsigned_long,_false>)0;
    _Stack_a8._M_bound_args.super__Tuple_impl<0UL,_boost::system::error_code,_unsigned_long>.
    super__Head_base<0UL,_boost::system::error_code,_false>._M_head_impl.val_ = 0x5f;
    boost::asio::
    post<boost::asio::io_context,std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,(_Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_(boost::asio::error::basic_errors,_unsigned_long)>
                       *)&_Stack_a8,(type *)0x0);
  }
  socket_closer::~socket_closer(&_Stack_a8._M_f.handler_);
  return;
}

Assistant:

void async_read_some(Mutable_Buffers const& buffers, Handler handler)
	{
		if (m_impl == nullptr)
		{
			post(m_io_service, std::bind<void>(std::move(handler), boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_read_handler);
		if (m_read_handler)
		{
			post(m_io_service, std::bind<void>(std::move(handler), boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}
		std::size_t bytes_added = 0;
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_read_buffer(i->data(), int(i->size()));
			bytes_added += i->size();
		}
		if (bytes_added == 0)
		{
			// if we're reading 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			post(m_io_service, std::bind<void>(std::move(handler), error_code(), std::size_t(0)));
			return;
		}

		m_read_handler = std::move(handler);
		issue_read();
	}